

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_quantizer_one_pass(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  av1_extracfg *in_RSI;
  long in_RDI;
  av1_extracfg extra_cfg;
  aom_codec_enc_cfg_t *cfg;
  int qp;
  int *local_298;
  undefined4 in_stack_fffffffffffffd78;
  uint uVar1;
  undefined1 local_280 [204];
  undefined1 local_1b4;
  long local_28;
  int local_1c;
  long local_10;
  aom_codec_err_t local_4;
  
  uVar1 = in_RSI->cpu_used;
  if (uVar1 < 0x29) {
    local_298 = (int *)((long)(int)uVar1 + *(long *)&in_RSI->sharpness);
    in_RSI->cpu_used = uVar1 + 8;
  }
  else {
    local_298 = *(int **)&in_RSI->enable_auto_bwd_ref;
    *(int **)&in_RSI->enable_auto_bwd_ref = local_298 + 2;
  }
  local_1c = *local_298;
  if ((local_1c < 0) || (0x3f < local_1c)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    local_28 = in_RDI + 0xd0;
    local_10 = in_RDI;
    memcpy(local_280,(void *)(in_RDI + 0x458),600);
    *(int *)(local_28 + 0x90) = local_1c;
    *(int *)(local_28 + 0x8c) = local_1c;
    local_1b4 = 0;
    *(undefined4 *)(*(long *)(*(long *)(local_10 + 0xb50) + 0x160) + 0x608a8) = 1;
    local_4 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)
                               CONCAT44(uVar1,in_stack_fffffffffffffd78),in_RSI);
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_quantizer_one_pass(aom_codec_alg_priv_t *ctx,
                                                   va_list args) {
  const int qp = CAST(AV1E_SET_QUANTIZER_ONE_PASS, args);

  if (qp < 0 || qp > 63) return AOM_CODEC_INVALID_PARAM;

  aom_codec_enc_cfg_t *cfg = &ctx->cfg;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  cfg->rc_min_quantizer = cfg->rc_max_quantizer = qp;
  extra_cfg.aq_mode = 0;
  ctx->ppi->cpi->rc.use_external_qp_one_pass = 1;

  return update_extra_cfg(ctx, &extra_cfg);
}